

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# romfs.cpp
# Opt level: O0

int __thiscall pstore::romfs::romfs::chdir(romfs *this,char *__path)

{
  error_code eVar1;
  error_or<pstore::gsl::not_null<const_pstore::romfs::dirent_*>_> local_90;
  error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_> local_70;
  anon_class_8_1_8991fb9c local_58;
  undefined1 local_50 [8];
  error_or<const_pstore::romfs::directory_*> eo;
  anon_class_8_1_8991fb9c set_cwd;
  anon_class_1_0_00000001 dirent_to_directory;
  romfs *this_local;
  not_null<const_char_*> path_local;
  
  local_58.this = this;
  eo._16_8_ = this;
  parse_path(&local_90,this,(not_null<const_char_*>)__path);
  pstore::operator>>=(&local_70,&local_90);
  pstore::operator>>=((error_or<const_pstore::romfs::directory_*> *)local_50,&local_70,local_58);
  error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_>::~error_or(&local_70);
  error_or<pstore::gsl::not_null<const_pstore::romfs::dirent_*>_>::~error_or(&local_90);
  eVar1 = error_or<const_pstore::romfs::directory_*>::get_error
                    ((error_or<const_pstore::romfs::directory_*> *)local_50);
  error_or<const_pstore::romfs::directory_*>::~error_or
            ((error_or<const_pstore::romfs::directory_*> *)local_50);
  return eVar1._M_value;
}

Assistant:

std::error_code romfs::chdir (not_null<czstring> const path) {
            auto const dirent_to_directory = [] (dirent_ptr const de) { return de->opendir (); };

            auto const set_cwd = [this] (directory const * const d) {
                cwd_ = d; // Warning: side-effect!
                return error_or<directory const *> (d);
            };

            auto const eo = (this->parse_path (path) >>= dirent_to_directory) >>= set_cwd;
            return eo.get_error ();
        }